

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::ErrorMessage(FParser *this,FString *msg)

{
  uint uVar1;
  char *pcVar2;
  char *local_28;
  char *temp;
  int linenum;
  FString *msg_local;
  FParser *this_local;
  
  temp._4_4_ = 0;
  if ((this->Script->data <= this->Rover) && (this->Rover <= this->Script->data + this->Script->len)
     ) {
    for (local_28 = this->Script->data; local_28 < this->LineStart; local_28 = local_28 + 1) {
      if (*local_28 == '\n') {
        temp._4_4_ = temp._4_4_ + 1;
      }
    }
  }
  uVar1 = this->Script->scriptnum;
  pcVar2 = FString::GetChars(msg);
  FS_Error("Script %d, line %d: %s",(ulong)uVar1,(ulong)temp._4_4_,pcVar2);
  return;
}

Assistant:

void FParser::ErrorMessage(FString msg)
{
	int linenum = 0;

	// find the line number
	if(Rover >= Script->data && Rover <= Script->data+Script->len)
    {
		char *temp;
		for(temp = Script->data; temp<LineStart; temp++)
			if(*temp == '\n') linenum++;    // count EOLs
    }

	//lineinfo.Format("Script %d, line %d: ", Script->scriptnum, linenum);
	FS_Error("Script %d, line %d: %s", Script->scriptnum, linenum, msg.GetChars());
}